

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::Descriptor::DebugString(Descriptor *this,int depth,string *contents)

{
  size_type sVar1;
  int i_5;
  int depth_00;
  long lVar2;
  int i_3;
  long lVar3;
  long lVar4;
  long lVar5;
  int i;
  long lVar6;
  string prefix;
  SubstituteArg local_240;
  SubstituteArg local_210;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  groups;
  
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  std::__cxx11::string::_M_construct((ulong)&prefix,(char)depth * '\x02');
  std::__cxx11::string::append((char *)contents);
  depth_00 = depth + 1;
  anon_unknown_1::FormatLineOptions(depth_00,*(Message **)(this + 0x20),contents);
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &groups._M_t._M_impl.super__Rb_tree_header._M_header;
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  groups._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar4 = 0x48;
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (lVar6 = 0; lVar6 < *(int *)(this + 0x2c); lVar6 = lVar6 + 1) {
    if (*(int *)(*(long *)(this + 0x30) + -0x1c + lVar4) == 10) {
      local_240.text_ = *(char **)(*(long *)(this + 0x30) + lVar4);
      std::
      _Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
      ::_M_insert_unique<google::protobuf::Descriptor_const*>
                ((_Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
                  *)&groups,(Descriptor **)&local_240);
    }
    lVar4 = lVar4 + 0x78;
  }
  lVar4 = 0x48;
  for (lVar6 = 0; lVar6 < *(int *)(this + 0x68); lVar6 = lVar6 + 1) {
    if (*(int *)(*(long *)(this + 0x70) + -0x1c + lVar4) == 10) {
      local_240.text_ = *(char **)(*(long *)(this + 0x70) + lVar4);
      std::
      _Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
      ::_M_insert_unique<google::protobuf::Descriptor_const*>
                ((_Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
                  *)&groups,(Descriptor **)&local_240);
    }
    lVar4 = lVar4 + 0x78;
  }
  lVar4 = 0;
  for (lVar6 = 0; lVar6 < *(int *)(this + 0x38); lVar6 = lVar6 + 1) {
    local_240.text_ = (char *)(*(long *)(this + 0x40) + lVar4);
    sVar1 = std::
            set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
            ::count(&groups,(key_type *)&local_240);
    if (sVar1 == 0) {
      local_240.text_ = prefix._M_dataplus._M_p;
      local_240.size_ = (int)prefix._M_string_length;
      local_90.text_ = (char *)**(undefined8 **)(*(long *)(this + 0x40) + lVar4);
      local_90.size_ = *(int *)(*(undefined8 **)(*(long *)(this + 0x40) + lVar4) + 1);
      local_c0.text_ = (char *)0x0;
      local_c0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      local_1b0.text_ = (char *)0x0;
      local_1b0.size_ = -1;
      local_1e0.text_ = (char *)0x0;
      local_1e0.size_ = -1;
      local_210.text_ = (char *)0x0;
      local_210.size_ = -1;
      strings::SubstituteAndAppend
                (contents,"$0  message $1",&local_240,&local_90,&local_c0,&local_f0,&local_120,
                 &local_150,&local_180,&local_1b0,&local_1e0,&local_210);
      DebugString((Descriptor *)(*(long *)(this + 0x40) + lVar4),depth_00,contents);
    }
    lVar4 = lVar4 + 0x78;
  }
  lVar6 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(this + 0x48); lVar4 = lVar4 + 1) {
    EnumDescriptor::DebugString
              ((EnumDescriptor *)(*(long *)(this + 0x50) + lVar6),depth_00,contents);
    lVar6 = lVar6 + 0x38;
  }
  lVar6 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(this + 0x2c); lVar4 = lVar4 + 1) {
    FieldDescriptor::DebugString
              ((FieldDescriptor *)(*(long *)(this + 0x30) + lVar6),depth_00,contents);
    lVar6 = lVar6 + 0x78;
  }
  for (lVar4 = 0; lVar4 < *(int *)(this + 0x58); lVar4 = lVar4 + 1) {
    local_240.text_ = prefix._M_dataplus._M_p;
    local_240.size_ = (int)prefix._M_string_length;
    strings::internal::SubstituteArg::SubstituteArg
              (&local_90,*(int *)(*(long *)(this + 0x60) + lVar4 * 8));
    strings::internal::SubstituteArg::SubstituteArg
              (&local_c0,*(int *)(*(long *)(this + 0x60) + 4 + lVar4 * 8) + -1);
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    local_1b0.text_ = (char *)0x0;
    local_1b0.size_ = -1;
    local_1e0.text_ = (char *)0x0;
    local_1e0.size_ = -1;
    local_210.text_ = (char *)0x0;
    local_210.size_ = -1;
    strings::SubstituteAndAppend
              (contents,"$0  extensions $1 to $2;\n",&local_240,&local_90,&local_c0,&local_f0,
               &local_120,&local_150,&local_180,&local_1b0,&local_1e0,&local_210);
  }
  lVar5 = 0;
  lVar4 = 0;
  for (lVar6 = 0; lVar6 < *(int *)(this + 0x68); lVar6 = lVar6 + 1) {
    lVar2 = *(long *)(this + 0x70);
    lVar3 = *(long *)(lVar2 + 0x38 + lVar5);
    if (lVar3 != lVar4) {
      if (lVar5 != 0) {
        local_90.text_ = (char *)0x0;
        local_90.size_ = -1;
        local_c0.text_ = (char *)0x0;
        local_c0.size_ = -1;
        local_f0.text_ = (char *)0x0;
        local_f0.size_ = -1;
        local_120.text_ = (char *)0x0;
        local_120.size_ = -1;
        local_150.text_ = (char *)0x0;
        local_150.size_ = -1;
        local_180.text_ = (char *)0x0;
        local_180.size_ = -1;
        local_1b0.text_ = (char *)0x0;
        local_1b0.size_ = -1;
        local_1e0.text_ = (char *)0x0;
        local_240.text_ = prefix._M_dataplus._M_p;
        local_1e0.size_ = -1;
        local_210.text_ = (char *)0x0;
        local_240.size_ = (int)prefix._M_string_length;
        local_210.size_ = -1;
        strings::SubstituteAndAppend
                  (contents,"$0  }\n",&local_240,&local_90,&local_c0,&local_f0,&local_120,&local_150
                   ,&local_180,&local_1b0,&local_1e0,&local_210);
        lVar3 = *(long *)(*(long *)(this + 0x70) + 0x38 + lVar5);
      }
      local_240.text_ = prefix._M_dataplus._M_p;
      local_240.size_ = (int)prefix._M_string_length;
      local_90.text_ = (char *)**(undefined8 **)(lVar3 + 8);
      local_90.size_ = *(int *)(*(undefined8 **)(lVar3 + 8) + 1);
      local_c0.text_ = (char *)0x0;
      local_c0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      local_1b0.text_ = (char *)0x0;
      local_1b0.size_ = -1;
      local_1e0.text_ = (char *)0x0;
      local_1e0.size_ = -1;
      local_210.text_ = (char *)0x0;
      local_210.size_ = -1;
      strings::SubstituteAndAppend
                (contents,"$0  extend .$1 {\n",&local_240,&local_90,&local_c0,&local_f0,&local_120,
                 &local_150,&local_180,&local_1b0,&local_1e0,&local_210);
      lVar2 = *(long *)(this + 0x70);
      lVar4 = lVar3;
    }
    FieldDescriptor::DebugString((FieldDescriptor *)(lVar2 + lVar5),depth + 2,contents);
    lVar5 = lVar5 + 0x78;
  }
  if (0 < *(int *)(this + 0x68)) {
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    local_1b0.text_ = (char *)0x0;
    local_1b0.size_ = -1;
    local_1e0.text_ = (char *)0x0;
    local_240.text_ = prefix._M_dataplus._M_p;
    local_1e0.size_ = -1;
    local_210.text_ = (char *)0x0;
    local_240.size_ = (int)prefix._M_string_length;
    local_210.size_ = -1;
    strings::SubstituteAndAppend
              (contents,"$0  }\n",&local_240,&local_90,&local_c0,&local_f0,&local_120,&local_150,
               &local_180,&local_1b0,&local_1e0,&local_210);
  }
  local_90.text_ = (char *)0x0;
  local_90.size_ = -1;
  local_c0.text_ = (char *)0x0;
  local_c0.size_ = -1;
  local_f0.text_ = (char *)0x0;
  local_f0.size_ = -1;
  local_120.text_ = (char *)0x0;
  local_120.size_ = -1;
  local_150.text_ = (char *)0x0;
  local_150.size_ = -1;
  local_180.text_ = (char *)0x0;
  local_180.size_ = -1;
  local_1b0.text_ = (char *)0x0;
  local_1b0.size_ = -1;
  local_1e0.text_ = (char *)0x0;
  local_240.text_ = prefix._M_dataplus._M_p;
  local_1e0.size_ = -1;
  local_210.text_ = (char *)0x0;
  local_240.size_ = (int)prefix._M_string_length;
  local_210.size_ = -1;
  strings::SubstituteAndAppend
            (contents,"$0}\n",&local_240,&local_90,&local_c0,&local_f0,&local_120,&local_150,
             &local_180,&local_1b0,&local_1e0,&local_210);
  std::
  _Rb_tree<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::~_Rb_tree(&groups._M_t);
  std::__cxx11::string::~string((string *)&prefix);
  return;
}

Assistant:

void Descriptor::DebugString(int depth, string *contents) const {
  string prefix(depth * 2, ' ');
  ++depth;
  contents->append(" {\n");

  FormatLineOptions(depth, options(), contents);

  // Find all the 'group' types for fields and extensions; we will not output
  // their nested definitions (those will be done with their group field
  // descriptor).
  set<const Descriptor*> groups;
  for (int i = 0; i < field_count(); i++) {
    if (field(i)->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(field(i)->message_type());
    }
  }
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(extension(i)->message_type());
    }
  }

  for (int i = 0; i < nested_type_count(); i++) {
    if (groups.count(nested_type(i)) == 0) {
      strings::SubstituteAndAppend(contents, "$0  message $1",
                                   prefix, nested_type(i)->name());
      nested_type(i)->DebugString(depth, contents);
    }
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->DebugString(depth, contents);
  }
  for (int i = 0; i < field_count(); i++) {
    field(i)->DebugString(depth, contents);
  }

  for (int i = 0; i < extension_range_count(); i++) {
    strings::SubstituteAndAppend(contents, "$0  extensions $1 to $2;\n",
                                 prefix,
                                 extension_range(i)->start,
                                 extension_range(i)->end - 1);
  }

  // Group extensions by what they extend, so they can be printed out together.
  const Descriptor* containing_type = NULL;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->containing_type() != containing_type) {
      if (i > 0) strings::SubstituteAndAppend(contents, "$0  }\n", prefix);
      containing_type = extension(i)->containing_type();
      strings::SubstituteAndAppend(contents, "$0  extend .$1 {\n",
                                   prefix, containing_type->full_name());
    }
    extension(i)->DebugString(depth + 1, contents);
  }
  if (extension_count() > 0)
    strings::SubstituteAndAppend(contents, "$0  }\n", prefix);

  strings::SubstituteAndAppend(contents, "$0}\n", prefix);
}